

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O0

let * __thiscall let::format_time(let *this,time_t rawtime,string *format)

{
  char *__format;
  allocator local_81;
  tm *local_80;
  tm *timeinfo;
  char buffer [80];
  string *format_local;
  time_t rawtime_local;
  
  format_local = (string *)rawtime;
  rawtime_local = (time_t)this;
  local_80 = localtime((time_t *)&format_local);
  __format = (char *)std::__cxx11::string::c_str();
  strftime((char *)&timeinfo,0x50,__format,local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,(char *)&timeinfo,&local_81);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return this;
}

Assistant:

std::string format_time(time_t rawtime, const std::string &format)
{
    char buffer[80];
    struct tm *timeinfo = localtime(&rawtime);
    strftime(buffer, sizeof(buffer), format.c_str(), timeinfo);
    return {buffer};
}